

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
          (clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *v,uint weight)

{
  pair<crnlib::vec<16U,_float>,_unsigned_int> local_60;
  uint local_1c;
  vec<16U,_float> *pvStack_18;
  uint weight_local;
  vec<16U,_float> *v_local;
  clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  local_1c = weight;
  pvStack_18 = v;
  v_local = (vec<16U,_float> *)this;
  std::make_pair<crnlib::vec<16u,float>const&,unsigned_int&>(&local_60,v,&local_1c);
  vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::push_back
            (&this->m_training_vecs,&local_60);
  return;
}

Assistant:

void add_training_vec(const VectorType& v, uint weight)
        {
            m_training_vecs.push_back(std::make_pair(v, weight));
        }